

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

string * __thiscall
llvm::Triple::normalize_abi_cxx11_(string *__return_storage_ptr__,Triple *this,StringRef Str)

{
  StringRef *pSVar1;
  string *buffer;
  ulong __n;
  ArchType AVar2;
  size_t sVar3;
  StringRef *pSVar4;
  size_t sVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  size_t sVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  StringRef SVar12;
  byte local_a81;
  byte local_a71;
  byte local_a29;
  bool local_a01;
  bool local_9f1;
  bool local_9d1;
  bool local_961;
  bool local_929;
  uint local_8a8;
  uint e;
  uint i_2;
  size_t local_898;
  char *local_850;
  size_t local_848;
  Twine local_800;
  string local_7e8;
  char *local_7c8;
  size_t local_7c0;
  undefined1 local_7b8 [8];
  StringRef AndroidVersion;
  string local_798 [8];
  string NormalizedEnvironment;
  uint local_754;
  undefined1 auStack_750 [4];
  uint i_1;
  StringRef CurrentComponent_1;
  undefined1 auStack_738 [4];
  uint i;
  StringRef CurrentComponent;
  StringRef Comp;
  bool local_69d;
  uint local_69c;
  uint uStack_698;
  bool Valid;
  uint Idx;
  uint Pos;
  bool Found [4];
  ObjectFormatType local_67c;
  ObjectFormatType ObjectFormat;
  EnvironmentType local_664;
  EnvironmentType Environment;
  OSType local_62c;
  OSType OS;
  VendorType local_614;
  VendorType Vendor;
  ArchType local_5fc;
  undefined1 auStack_5f8 [4];
  ArchType Arch;
  SmallVector<llvm::StringRef,_4U> Components;
  undefined1 auStack_5a0 [6];
  bool IsCygwin;
  bool IsMinGW32;
  StringRef Str_local;
  string *Normalized;
  char *local_230;
  ulong local_228;
  undefined8 local_220;
  StringRef *local_218;
  char *local_210;
  char *local_208;
  unsigned_long local_200;
  unsigned_long local_1f8;
  unsigned_long local_1f0;
  StringRef *local_1e8;
  undefined1 local_1e0 [16];
  StringRef *local_1d0;
  char **local_1c8;
  char *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  char *local_1a8;
  char *local_1a0;
  int local_194;
  size_t local_190;
  char *local_188;
  char *local_180;
  int local_174;
  size_t local_170;
  char *local_168;
  char *local_160;
  int local_154;
  size_t local_150;
  char *local_148;
  char *local_140;
  int local_134;
  size_t local_130;
  char *local_128;
  char *local_120;
  int local_114;
  size_t local_110;
  size_t local_108;
  char *local_100;
  int local_f4;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  SmallVectorBase *local_d8;
  SmallVectorBase *local_d0;
  SmallVectorBase *local_c8;
  SmallVectorBase *local_c0;
  SmallVectorBase *local_b8;
  SmallVectorBase *local_b0;
  SmallVectorBase *local_a8;
  SmallVectorBase *local_a0;
  SmallVectorBase *local_98;
  SmallVectorBase *local_90;
  SmallVectorBase *local_88;
  SmallVectorBase *local_80;
  SmallVectorBase *local_78;
  SmallVectorBase *local_70;
  SmallVectorBase *local_68;
  SmallVectorBase *local_60;
  SmallVectorBase *local_58;
  SmallVectorBase *local_50;
  SmallVectorBase *local_48;
  SmallVectorBase *local_40;
  SmallVectorBase *local_38;
  SmallVectorBase *local_30;
  SmallVectorBase *local_28;
  SmallVectorBase *local_20;
  SmallVectorBase *local_18;
  SmallVectorBase *local_10;
  
  Str_local.Data = Str.Data;
  Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
  super_AlignedCharArray<8UL,_16UL>.buffer[0xf] = '\0';
  Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
  super_AlignedCharArray<8UL,_16UL>.buffer[0xe] = '\0';
  _auStack_5a0 = this;
  Str_local.Length = (size_t)__return_storage_ptr__;
  SmallVector<llvm::StringRef,_4U>::SmallVector((SmallVector<llvm::StringRef,_4U> *)auStack_5f8);
  StringRef::split((StringRef *)auStack_5a0,(SmallVectorImpl<llvm::StringRef> *)auStack_5f8,'-',-1,
                   true);
  local_5fc = UnknownArch;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
  if (sVar3 != 0) {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
    if (sVar3 == 0) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    local_d8 = (SmallVectorBase *)auStack_5f8;
    local_5fc = parseArch(*_auStack_5f8);
  }
  local_614 = UnknownVendor;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
  if (1 < sVar3) {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
    if (sVar3 < 2) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    local_d0 = (SmallVectorBase *)auStack_5f8;
    local_614 = parseVendor(_auStack_5f8[1]);
  }
  local_62c = UnknownOS;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
  if (2 < sVar3) {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
    if (sVar3 < 3) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    local_c8 = (SmallVectorBase *)auStack_5f8;
    local_62c = parseOS(_auStack_5f8[2]);
    sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
    pSVar1 = _auStack_5f8;
    if (sVar3 < 3) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    pSVar4 = _auStack_5f8 + 2;
    local_c0 = (SmallVectorBase *)auStack_5f8;
    sVar5 = strlen("cygwin");
    local_929 = false;
    if (sVar5 <= pSVar1[2].Length) {
      local_180 = pSVar4->Data;
      local_188 = "cygwin";
      local_190 = sVar5;
      if (sVar5 == 0) {
        local_174 = 0;
      }
      else {
        local_174 = memcmp(local_180,"cygwin",sVar5);
      }
      local_929 = local_174 == 0;
    }
    Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xe] = local_929;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
    pSVar1 = _auStack_5f8;
    if (sVar3 < 3) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    pSVar4 = _auStack_5f8 + 2;
    local_b8 = (SmallVectorBase *)auStack_5f8;
    sVar5 = strlen("mingw");
    local_961 = false;
    if (sVar5 <= pSVar1[2].Length) {
      local_160 = pSVar4->Data;
      local_168 = "mingw";
      local_170 = sVar5;
      if (sVar5 == 0) {
        local_154 = 0;
      }
      else {
        local_154 = memcmp(local_160,"mingw",sVar5);
      }
      local_961 = local_154 == 0;
    }
    Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xf] = local_961;
  }
  local_664 = UnknownEnvironment;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
  if (3 < sVar3) {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
    if (sVar3 < 4) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    local_b0 = (SmallVectorBase *)auStack_5f8;
    local_664 = parseEnvironment(_auStack_5f8[3]);
  }
  local_67c = UnknownObjectFormat;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
  if (4 < sVar3) {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
    if (sVar3 < 5) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    _Pos = _auStack_5f8[4].Data;
    local_a8 = (SmallVectorBase *)auStack_5f8;
    local_67c = parseFormat(_auStack_5f8[4]);
  }
  Idx._0_1_ = local_5fc != UnknownArch;
  Idx._1_1_ = local_614 != UnknownVendor;
  Idx._2_1_ = local_62c != UnknownOS;
  Idx._3_1_ = local_664 != UnknownEnvironment;
  uStack_698 = 0;
  while( true ) {
    sVar3 = array_lengthof<bool,4ul>((bool (*) [4])&Idx);
    if (uStack_698 == sVar3) {
      std::__cxx11::string::string(local_798);
      bVar11 = false;
      if (local_664 == Android) {
        sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
        pSVar1 = _auStack_5f8;
        if (sVar3 < 4) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        pSVar4 = _auStack_5f8 + 3;
        AndroidVersion.Length = (size_t)anon_var_dwarf_3e3be4;
        local_78 = (SmallVectorBase *)auStack_5f8;
        sVar5 = strlen("androideabi");
        bVar11 = false;
        if (sVar5 <= pSVar1[3].Length) {
          local_100 = pSVar4->Data;
          local_108 = AndroidVersion.Length;
          local_110 = sVar5;
          if (sVar5 == 0) {
            local_f4 = 0;
          }
          else {
            local_f4 = memcmp(local_100,(void *)AndroidVersion.Length,sVar5);
          }
          bVar11 = local_f4 == 0;
        }
      }
      if (bVar11) {
        sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
        pSVar1 = _auStack_5f8;
        if (sVar3 < 4) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        pSVar4 = _auStack_5f8 + 3;
        local_220 = 0xb;
        local_218 = pSVar4;
        local_1d0 = pSVar4;
        local_70 = (SmallVectorBase *)auStack_5f8;
        if (_auStack_5f8[3].Length < 0xb) {
          __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                        ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
        }
        local_1f0 = 0xb;
        local_1f8 = 0xffffffffffffffff;
        local_1e8 = pSVar4;
        puVar7 = std::min<unsigned_long>(&local_1f0,&_auStack_5f8[3].Length);
        local_1f0 = *puVar7;
        pcVar9 = pSVar4->Data + local_1f0;
        local_200 = pSVar1[3].Length - local_1f0;
        puVar7 = std::min<unsigned_long>(&local_1f8,&local_200);
        AndroidVersion.Data = (char *)*puVar7;
        local_e0 = local_1e0;
        local_7b8 = (undefined1  [8])pcVar9;
        local_210 = pcVar9;
        local_208 = AndroidVersion.Data;
        local_f0 = AndroidVersion.Data;
        local_e8 = pcVar9;
        if (AndroidVersion.Data == (char *)0x0) {
          local_7c8 = "android";
          local_7c0 = strlen("android");
          sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
          if (sVar3 < 4) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                         );
          }
          _auStack_5f8[3].Data = local_7c8;
          _auStack_5f8[3].Length = local_7c0;
          local_68 = (SmallVectorBase *)auStack_5f8;
        }
        else {
          Twine::Twine(&local_800,"android",(StringRef *)local_7b8);
          Twine::str_abi_cxx11_(&local_7e8,&local_800);
          std::__cxx11::string::operator=(local_798,(string *)&local_7e8);
          std::__cxx11::string::~string((string *)&local_7e8);
          pcVar9 = (char *)std::__cxx11::string::data();
          sVar3 = std::__cxx11::string::length();
          sVar8 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
          if (sVar8 < 4) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                         );
          }
          _auStack_5f8[3].Data = pcVar9;
          _auStack_5f8[3].Length = sVar3;
          local_60 = (SmallVectorBase *)auStack_5f8;
        }
      }
      if ((local_614 == SUSE) && (local_664 == GNUEABI)) {
        sVar5 = strlen("gnueabihf");
        sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
        if (sVar3 < 4) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        _auStack_5f8[3].Data = "gnueabihf";
        _auStack_5f8[3].Length = sVar5;
        local_58 = (SmallVectorBase *)auStack_5f8;
      }
      if (local_62c == Win32) {
        SmallVectorImpl<llvm::StringRef>::resize((SmallVectorImpl<llvm::StringRef> *)auStack_5f8,4);
        sVar5 = strlen("windows");
        sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
        if (sVar3 < 3) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        _auStack_5f8[2].Data = "windows";
        _auStack_5f8[2].Length = sVar5;
        local_50 = (SmallVectorBase *)auStack_5f8;
        if (local_664 == UnknownEnvironment) {
          if ((local_67c == UnknownObjectFormat) || (local_67c == COFF)) {
            sVar5 = strlen("msvc");
            sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
            if (sVar3 < 4) {
              __assert_fail("idx < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                            ,0x9b,
                            "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                           );
            }
            _auStack_5f8[3].Data = "msvc";
            _auStack_5f8[3].Length = sVar5;
            local_48 = (SmallVectorBase *)auStack_5f8;
          }
          else {
            SVar12 = getObjectFormatTypeName(local_67c);
            sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
            if (sVar3 < 4) {
              __assert_fail("idx < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                            ,0x9b,
                            "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                           );
            }
            local_850 = SVar12.Data;
            _auStack_5f8[3].Data = local_850;
            local_848 = SVar12.Length;
            _auStack_5f8[3].Length = local_848;
            local_40 = (SmallVectorBase *)auStack_5f8;
          }
        }
      }
      else if ((Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
                super_AlignedCharArray<8UL,_16UL>.buffer[0xf] & 1U) == 0) {
        if ((Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
             super_AlignedCharArray<8UL,_16UL>.buffer[0xe] & 1U) != 0) {
          SmallVectorImpl<llvm::StringRef>::resize
                    ((SmallVectorImpl<llvm::StringRef> *)auStack_5f8,4);
          sVar5 = strlen("windows");
          sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
          if (sVar3 < 3) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                         );
          }
          _auStack_5f8[2].Data = "windows";
          _auStack_5f8[2].Length = sVar5;
          local_28 = (SmallVectorBase *)auStack_5f8;
          sVar5 = strlen("cygnus");
          sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
          if (sVar3 < 4) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                         );
          }
          _auStack_5f8[3].Data = "cygnus";
          _auStack_5f8[3].Length = sVar5;
          local_20 = (SmallVectorBase *)auStack_5f8;
        }
      }
      else {
        SmallVectorImpl<llvm::StringRef>::resize((SmallVectorImpl<llvm::StringRef> *)auStack_5f8,4);
        sVar5 = strlen("windows");
        sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
        if (sVar3 < 3) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        _auStack_5f8[2].Data = "windows";
        _auStack_5f8[2].Length = sVar5;
        local_38 = (SmallVectorBase *)auStack_5f8;
        sVar5 = strlen("gnu");
        sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
        if (sVar3 < 4) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        _auStack_5f8[3].Data = "gnu";
        _auStack_5f8[3].Length = sVar5;
        local_30 = (SmallVectorBase *)auStack_5f8;
      }
      if (((((Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
              super_AlignedCharArray<8UL,_16UL>.buffer[0xf] & 1U) != 0) ||
           ((Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
             super_AlignedCharArray<8UL,_16UL>.buffer[0xe] & 1U) != 0)) ||
          ((local_62c == Win32 && (local_664 != UnknownEnvironment)))) &&
         ((local_67c != UnknownObjectFormat && (local_67c != COFF)))) {
        SmallVectorImpl<llvm::StringRef>::resize((SmallVectorImpl<llvm::StringRef> *)auStack_5f8,5);
        SVar12 = getObjectFormatTypeName(local_67c);
        sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
        if (sVar3 < 5) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        _i_2 = SVar12.Data;
        _auStack_5f8[4].Data = _i_2;
        local_898 = SVar12.Length;
        _auStack_5f8[4].Length = local_898;
        local_18 = (SmallVectorBase *)auStack_5f8;
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_8a8 = 0;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
      while( true ) {
        if (local_8a8 == (uint)sVar3) {
          std::__cxx11::string::~string(local_798);
          SmallVector<llvm::StringRef,_4U>::~SmallVector
                    ((SmallVector<llvm::StringRef,_4U> *)auStack_5f8);
          return __return_storage_ptr__;
        }
        if (local_8a8 != 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'-');
        }
        sVar8 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
        if (sVar8 <= local_8a8) break;
        buffer = (string *)_auStack_5f8[local_8a8].Data;
        SVar12.Length = (size_t)buffer;
        SVar12.Data = (char *)_auStack_5f8[local_8a8].Length;
        local_10 = (SmallVectorBase *)auStack_5f8;
        llvm::operator+=((llvm *)__return_storage_ptr__,buffer,SVar12);
        local_8a8 = local_8a8 + 1;
      }
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    if ((*(byte *)((long)&Idx + (ulong)uStack_698) & 1) == 0) break;
LAB_002ccfb0:
    uStack_698 = uStack_698 + 1;
  }
  local_69c = 0;
LAB_002cc2d3:
  sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
  if (local_69c != sVar3) {
    sVar3 = array_lengthof<bool,4ul>((bool (*) [4])&Idx);
    if ((local_69c < sVar3) && ((*(byte *)((long)&Idx + (ulong)local_69c) & 1) != 0))
    goto LAB_002ccf9a;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
    if (sVar3 <= local_69c) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    pSVar1 = _auStack_5f8 + local_69c;
    pcVar9 = pSVar1->Data;
    __n = pSVar1->Length;
    SVar12 = *pSVar1;
    local_a0 = (SmallVectorBase *)auStack_5f8;
    switch(uStack_698) {
    case 0:
      AVar2 = parseArch(*pSVar1);
      local_69d = AVar2 != UnknownArch;
      break;
    case 1:
      local_614 = parseVendor(*pSVar1);
      local_69d = local_614 != UnknownVendor;
      break;
    case 2:
      local_62c = parseOS(*pSVar1);
      sVar5 = strlen("cygwin");
      local_9d1 = false;
      if (sVar5 <= __n) {
        local_148 = "cygwin";
        local_150 = sVar5;
        local_140 = pcVar9;
        if (sVar5 == 0) {
          local_134 = 0;
        }
        else {
          local_134 = memcmp(pcVar9,"cygwin",sVar5);
        }
        local_9d1 = local_134 == 0;
      }
      Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
      super_AlignedCharArray<8UL,_16UL>.buffer[0xe] = local_9d1;
      sVar5 = strlen("mingw");
      local_9f1 = false;
      if (sVar5 <= __n) {
        local_128 = "mingw";
        local_130 = sVar5;
        local_120 = pcVar9;
        if (sVar5 == 0) {
          local_114 = 0;
        }
        else {
          local_114 = memcmp(pcVar9,"mingw",sVar5);
        }
        local_9f1 = local_114 == 0;
      }
      Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
      super_AlignedCharArray<8UL,_16UL>.buffer[0xf] = local_9f1;
      local_a01 = true;
      if ((local_62c == UnknownOS) &&
         (local_a01 = true,
         (Components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
          super_AlignedCharArray<8UL,_16UL>.buffer[0xe] & 1U) == 0)) {
        local_a01 = local_9f1;
      }
      local_69d = local_a01;
      break;
    case 3:
      local_664 = parseEnvironment(*pSVar1);
      local_69d = local_664 != UnknownEnvironment;
      if (!local_69d) {
        CurrentComponent.Length = (size_t)pcVar9;
        local_67c = parseFormat(SVar12);
        local_69d = local_67c != UnknownObjectFormat;
      }
      break;
    default:
      llvm_unreachable_internal
                ("unexpected component type!",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                 ,0x329);
    }
    if (local_69d == false) goto LAB_002ccf9a;
    if (uStack_698 < local_69c) {
      _auStack_738 = "";
      CurrentComponent.Data = (char *)strlen("");
      sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
      if (sVar3 <= local_69c) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                     );
      }
      local_98 = (SmallVectorBase *)auStack_5f8;
      std::swap<llvm::StringRef>((StringRef *)auStack_738,_auStack_5f8 + local_69c);
      CurrentComponent_1.Length._4_4_ = uStack_698;
      while (CurrentComponent.Data != (char *)0x0) {
        while( true ) {
          uVar6 = (ulong)CurrentComponent_1.Length._4_4_;
          sVar3 = array_lengthof<bool,4ul>((bool (*) [4])&Idx);
          local_a29 = 0;
          if (uVar6 < sVar3) {
            local_a29 = *(byte *)((long)&Idx + (ulong)CurrentComponent_1.Length._4_4_);
          }
          if ((local_a29 & 1) == 0) break;
          CurrentComponent_1.Length._4_4_ = CurrentComponent_1.Length._4_4_ + 1;
        }
        uVar6 = (ulong)CurrentComponent_1.Length._4_4_;
        sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
        if (sVar3 <= uVar6) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        local_90 = (SmallVectorBase *)auStack_5f8;
        std::swap<llvm::StringRef>((StringRef *)auStack_738,_auStack_5f8 + uVar6);
        CurrentComponent_1.Length._4_4_ = CurrentComponent_1.Length._4_4_ + 1;
      }
    }
    else {
      while (local_69c < uStack_698) {
        _auStack_750 = "";
        CurrentComponent_1.Data = (char *)strlen("");
        local_754 = local_69c;
        while (sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8), local_754 < sVar3) {
          sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
          if (sVar3 <= local_754) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                         );
          }
          local_88 = (SmallVectorBase *)auStack_5f8;
          std::swap<llvm::StringRef>((StringRef *)auStack_750,_auStack_5f8 + local_754);
          if (CurrentComponent_1.Data == (char *)0x0) break;
          do {
            local_754 = local_754 + 1;
            sVar3 = array_lengthof<bool,4ul>((bool (*) [4])&Idx);
            local_a71 = 0;
            if (local_754 < sVar3) {
              local_a71 = *(byte *)((long)&Idx + (ulong)local_754);
            }
          } while ((local_a71 & 1) != 0);
        }
        if (CurrentComponent_1.Data != (char *)0x0) {
          SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                    ((SmallVectorTemplateBase<llvm::StringRef,_true> *)auStack_5f8,
                     (StringRef *)auStack_750);
        }
        do {
          local_69c = local_69c + 1;
          sVar3 = array_lengthof<bool,4ul>((bool (*) [4])&Idx);
          local_a81 = 0;
          if (local_69c < sVar3) {
            local_a81 = *(byte *)((long)&Idx + (ulong)local_69c);
          }
        } while ((local_a81 & 1) != 0);
      }
    }
    sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
    bVar11 = false;
    if (uStack_698 < sVar3) {
      sVar3 = SmallVectorBase::size((SmallVectorBase *)auStack_5f8);
      if (sVar3 <= uStack_698) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                     );
      }
      local_230 = _auStack_5f8[uStack_698].Data;
      local_228 = _auStack_5f8[uStack_698].Length;
      local_1c8 = &local_230;
      bVar10 = false;
      NormalizedEnvironment.field_2._8_8_ = pcVar9;
      local_1c0 = pcVar9;
      local_1b8 = __n;
      local_80 = (SmallVectorBase *)auStack_5f8;
      if (local_228 == __n) {
        local_1b0 = __n;
        local_1a8 = pcVar9;
        local_1a0 = local_230;
        if (__n == 0) {
          local_194 = 0;
        }
        else {
          local_194 = memcmp(local_230,pcVar9,__n);
        }
        bVar10 = local_194 == 0;
      }
      bVar11 = false;
      if (bVar10) {
        bVar11 = true;
      }
    }
    if (!bVar11) {
      __assert_fail("Pos < Components.size() && Components[Pos] == Comp && \"Component moved wrong!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                    ,0x374,"static std::string llvm::Triple::normalize(StringRef)");
    }
    *(undefined1 *)((long)&Idx + (ulong)uStack_698) = 1;
  }
  goto LAB_002ccfb0;
LAB_002ccf9a:
  local_69c = local_69c + 1;
  goto LAB_002cc2d3;
}

Assistant:

std::string Triple::normalize(StringRef Str) {
  bool IsMinGW32 = false;
  bool IsCygwin = false;

  // Parse into components.
  SmallVector<StringRef, 4> Components;
  Str.split(Components, '-');

  // If the first component corresponds to a known architecture, preferentially
  // use it for the architecture.  If the second component corresponds to a
  // known vendor, preferentially use it for the vendor, etc.  This avoids silly
  // component movement when a component parses as (eg) both a valid arch and a
  // valid os.
  ArchType Arch = UnknownArch;
  if (Components.size() > 0)
    Arch = parseArch(Components[0]);
  VendorType Vendor = UnknownVendor;
  if (Components.size() > 1)
    Vendor = parseVendor(Components[1]);
  OSType OS = UnknownOS;
  if (Components.size() > 2) {
    OS = parseOS(Components[2]);
    IsCygwin = Components[2].startswith("cygwin");
    IsMinGW32 = Components[2].startswith("mingw");
  }
  EnvironmentType Environment = UnknownEnvironment;
  if (Components.size() > 3)
    Environment = parseEnvironment(Components[3]);
  ObjectFormatType ObjectFormat = UnknownObjectFormat;
  if (Components.size() > 4)
    ObjectFormat = parseFormat(Components[4]);

  // Note which components are already in their final position.  These will not
  // be moved.
  bool Found[4];
  Found[0] = Arch != UnknownArch;
  Found[1] = Vendor != UnknownVendor;
  Found[2] = OS != UnknownOS;
  Found[3] = Environment != UnknownEnvironment;

  // If they are not there already, permute the components into their canonical
  // positions by seeing if they parse as a valid architecture, and if so moving
  // the component to the architecture position etc.
  for (unsigned Pos = 0; Pos != array_lengthof(Found); ++Pos) {
    if (Found[Pos])
      continue; // Already in the canonical position.

    for (unsigned Idx = 0; Idx != Components.size(); ++Idx) {
      // Do not reparse any components that already matched.
      if (Idx < array_lengthof(Found) && Found[Idx])
        continue;

      // Does this component parse as valid for the target position?
      bool Valid = false;
      StringRef Comp = Components[Idx];
      switch (Pos) {
      default: llvm_unreachable("unexpected component type!");
      case 0:
        Arch = parseArch(Comp);
        Valid = Arch != UnknownArch;
        break;
      case 1:
        Vendor = parseVendor(Comp);
        Valid = Vendor != UnknownVendor;
        break;
      case 2:
        OS = parseOS(Comp);
        IsCygwin = Comp.startswith("cygwin");
        IsMinGW32 = Comp.startswith("mingw");
        Valid = OS != UnknownOS || IsCygwin || IsMinGW32;
        break;
      case 3:
        Environment = parseEnvironment(Comp);
        Valid = Environment != UnknownEnvironment;
        if (!Valid) {
          ObjectFormat = parseFormat(Comp);
          Valid = ObjectFormat != UnknownObjectFormat;
        }
        break;
      }
      if (!Valid)
        continue; // Nope, try the next component.

      // Move the component to the target position, pushing any non-fixed
      // components that are in the way to the right.  This tends to give
      // good results in the common cases of a forgotten vendor component
      // or a wrongly positioned environment.
      if (Pos < Idx) {
        // Insert left, pushing the existing components to the right.  For
        // example, a-b-i386 -> i386-a-b when moving i386 to the front.
        StringRef CurrentComponent(""); // The empty component.
        // Replace the component we are moving with an empty component.
        std::swap(CurrentComponent, Components[Idx]);
        // Insert the component being moved at Pos, displacing any existing
        // components to the right.
        for (unsigned i = Pos; !CurrentComponent.empty(); ++i) {
          // Skip over any fixed components.
          while (i < array_lengthof(Found) && Found[i])
            ++i;
          // Place the component at the new position, getting the component
          // that was at this position - it will be moved right.
          std::swap(CurrentComponent, Components[i]);
        }
      } else if (Pos > Idx) {
        // Push right by inserting empty components until the component at Idx
        // reaches the target position Pos.  For example, pc-a -> -pc-a when
        // moving pc to the second position.
        do {
          // Insert one empty component at Idx.
          StringRef CurrentComponent(""); // The empty component.
          for (unsigned i = Idx; i < Components.size();) {
            // Place the component at the new position, getting the component
            // that was at this position - it will be moved right.
            std::swap(CurrentComponent, Components[i]);
            // If it was placed on top of an empty component then we are done.
            if (CurrentComponent.empty())
              break;
            // Advance to the next component, skipping any fixed components.
            while (++i < array_lengthof(Found) && Found[i])
              ;
          }
          // The last component was pushed off the end - append it.
          if (!CurrentComponent.empty())
            Components.push_back(CurrentComponent);

          // Advance Idx to the component's new position.
          while (++Idx < array_lengthof(Found) && Found[Idx])
            ;
        } while (Idx < Pos); // Add more until the final position is reached.
      }
      assert(Pos < Components.size() && Components[Pos] == Comp &&
             "Component moved wrong!");
      Found[Pos] = true;
      break;
    }
  }

  // Special case logic goes here.  At this point Arch, Vendor and OS have the
  // correct values for the computed components.
  std::string NormalizedEnvironment;
  if (Environment == Triple::Android && Components[3].startswith("androideabi")) {
    StringRef AndroidVersion = Components[3].drop_front(strlen("androideabi"));
    if (AndroidVersion.empty()) {
      Components[3] = "android";
    } else {
      NormalizedEnvironment = Twine("android", AndroidVersion).str();
      Components[3] = NormalizedEnvironment;
    }
  }

  // SUSE uses "gnueabi" to mean "gnueabihf"
  if (Vendor == Triple::SUSE && Environment == llvm::Triple::GNUEABI)
    Components[3] = "gnueabihf";

  if (OS == Triple::Win32) {
    Components.resize(4);
    Components[2] = "windows";
    if (Environment == UnknownEnvironment) {
      if (ObjectFormat == UnknownObjectFormat || ObjectFormat == Triple::COFF)
        Components[3] = "msvc";
      else
        Components[3] = getObjectFormatTypeName(ObjectFormat);
    }
  } else if (IsMinGW32) {
    Components.resize(4);
    Components[2] = "windows";
    Components[3] = "gnu";
  } else if (IsCygwin) {
    Components.resize(4);
    Components[2] = "windows";
    Components[3] = "cygnus";
  }
  if (IsMinGW32 || IsCygwin ||
      (OS == Triple::Win32 && Environment != UnknownEnvironment)) {
    if (ObjectFormat != UnknownObjectFormat && ObjectFormat != Triple::COFF) {
      Components.resize(5);
      Components[4] = getObjectFormatTypeName(ObjectFormat);
    }
  }

  // Stick the corrected components back together to form the normalized string.
  std::string Normalized;
  for (unsigned i = 0, e = Components.size(); i != e; ++i) {
    if (i) Normalized += '-';
    Normalized += Components[i];
  }
  return Normalized;
}